

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImStristr(char *haystack,char *haystack_end,char *needle,char *needle_end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  bool local_52;
  char *local_48;
  char *a;
  char *b;
  char *pcStack_30;
  char un0;
  char *needle_end_local;
  char *needle_local;
  char *haystack_end_local;
  char *haystack_local;
  
  pcStack_30 = needle_end;
  if (needle_end == (char *)0x0) {
    sVar4 = strlen(needle);
    pcStack_30 = needle + sVar4;
  }
  iVar1 = toupper((int)*needle);
  haystack_end_local = haystack;
  do {
    if ((haystack_end != (char *)0x0) || (local_52 = true, *haystack_end_local == '\0')) {
      local_52 = haystack_end != (char *)0x0 && haystack_end_local < haystack_end;
    }
    if (!local_52) {
      return (char *)0x0;
    }
    iVar2 = toupper((int)*haystack_end_local);
    if (iVar2 == (char)iVar1) {
      local_48 = haystack_end_local;
      for (a = needle + 1; local_48 = local_48 + 1, a < pcStack_30; a = a + 1) {
        iVar2 = toupper((int)*local_48);
        iVar3 = toupper((int)*a);
        if (iVar2 != iVar3) break;
      }
      if (a == pcStack_30) {
        return haystack_end_local;
      }
    }
    haystack_end_local = haystack_end_local + 1;
  } while( true );
}

Assistant:

const char* ImStristr(const char* haystack, const char* haystack_end, const char* needle, const char* needle_end)
{
    if (!needle_end)
        needle_end = needle + strlen(needle);

    const char un0 = (char)toupper(*needle);
    while ((!haystack_end && *haystack) || (haystack_end && haystack < haystack_end))
    {
        if (toupper(*haystack) == un0)
        {
            const char* b = needle + 1;
            for (const char* a = haystack + 1; b < needle_end; a++, b++)
                if (toupper(*a) != toupper(*b))
                    break;
            if (b == needle_end)
                return haystack;
        }
        haystack++;
    }
    return NULL;
}